

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

Reader __thiscall capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f0sp(Reader *this)

{
  bool bVar1;
  StringPtr SVar2;
  PointerReader local_28;
  
  bVar1 = (this->_reader).pointerCount < 2;
  local_28.pointer = (this->_reader).pointers + 1;
  if (bVar1) {
    local_28.pointer = (WirePointer *)0x0;
  }
  local_28.nestingLimit = (this->_reader).nestingLimit;
  if (bVar1) {
    local_28.segment._0_4_ = 0;
    local_28.segment._4_4_ = 0;
    local_28.capTable._0_4_ = 0;
    local_28.capTable._4_4_ = 0;
    local_28.nestingLimit = 0x7fffffff;
  }
  else {
    local_28.segment._0_4_ = *(undefined4 *)&(this->_reader).segment;
    local_28.segment._4_4_ = *(undefined4 *)((long)&(this->_reader).segment + 4);
    local_28.capTable._0_4_ = *(undefined4 *)&(this->_reader).capTable;
    local_28.capTable._4_4_ = *(undefined4 *)((long)&(this->_reader).capTable + 4);
  }
  SVar2.content =
       (ArrayPtr<const_char>)
       ::capnp::_::PointerReader::getBlob<capnp::Text>(&local_28,(void *)0x0,0);
  return (StringPtr)(StringPtr)SVar2.content;
}

Assistant:

inline PointerReader StructReader::getPointerField(StructPointerOffset ptrIndex) const {
  if (ptrIndex < pointerCount) {
    // Hacky because WirePointer is defined in the .c++ file (so is incomplete here).
    return PointerReader(segment, capTable, reinterpret_cast<const WirePointer*>(
        reinterpret_cast<const word*>(pointers) + ptrIndex * WORDS_PER_POINTER), nestingLimit);
  } else{
    return PointerReader();
  }
}